

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Am_Connection::Decrement_Check_List(Am_Connection *this)

{
  unsigned_long *puVar1;
  Am_Connection_Data *pAVar2;
  Incomplete_List_Ptr piVar3;
  Am_Receive_Method_Type *pAVar4;
  Am_Wrapper *value;
  
  pAVar2 = this->data;
  piVar3 = pAVar2->List_Queue;
  puVar1 = &piVar3->length;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  value = Am_Value_List::operator_cast_to_Am_Wrapper_(&piVar3->list);
  Am_Value_List::Push(&pAVar2->Value_Queue,value,true);
  pAVar2 = this->data;
  pAVar4 = (pAVar2->List_Queue->prev_receiver).Call;
  (pAVar2->my_receiver).from_wrapper = (pAVar2->List_Queue->prev_receiver).from_wrapper;
  (pAVar2->my_receiver).Call = pAVar4;
  piVar3 = this->data->List_Queue;
  this->data->List_Queue = piVar3->next;
  Am_Value_List::~Am_Value_List(&piVar3->list);
  operator_delete(piVar3);
  (*(this->data->my_receiver).Call)(this);
  return;
}

Assistant:

void
Am_Connection::Decrement_Check_List()
{
  if ((--(data->List_Queue->length)) == 0) {
    data->Value_Queue.Push(data->List_Queue->list);
    data->my_receiver = data->List_Queue->prev_receiver;
    Incomplete_List_Ptr temp = data->List_Queue;
    data->List_Queue = data->List_Queue->next;
    delete (temp);
    data->my_receiver.Call(this); // Now that we have the list, let the
                                  // user fn take it.
  }
}